

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * prvTidyFindHEAD(TidyDocImpl *doc)

{
  bool bVar1;
  Node *local_18;
  Node *node;
  TidyDocImpl *doc_local;
  
  local_18 = prvTidyFindHTML(doc);
  if (local_18 != (Node *)0x0) {
    local_18 = local_18->content;
    while( true ) {
      bVar1 = false;
      if (local_18 != (Node *)0x0) {
        bVar1 = false;
        if ((local_18 != (Node *)0x0) && (bVar1 = false, local_18->tag != (Dict *)0x0)) {
          bVar1 = local_18->tag->id == TidyTag_HEAD;
        }
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (!bVar1) break;
      local_18 = local_18->next;
    }
  }
  return local_18;
}

Assistant:

Node *TY_(FindHEAD)( TidyDocImpl* doc )
{
    Node *node = TY_(FindHTML)( doc );

    if ( node )
    {
        for ( node = node->content;
              node && !nodeIsHEAD(node); 
              node = node->next )
            /**/;
    }

    return node;
}